

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

bool argparse::Argument::is_float(string *aValue)

{
  byte bVar1;
  void *this;
  byte local_1ba;
  float local_194;
  istringstream aiStack_190 [4];
  float tFloat;
  istringstream tStream;
  string *aValue_local;
  
  std::__cxx11::istringstream::istringstream(aiStack_190,aValue,8);
  this = (void *)std::istream::operator>>(aiStack_190,std::noskipws);
  std::istream::operator>>(this,&local_194);
  bVar1 = std::ios::eof();
  local_1ba = 0;
  if ((bVar1 & 1) != 0) {
    local_1ba = std::ios::fail();
    local_1ba = local_1ba ^ 0xff;
  }
  std::__cxx11::istringstream::~istringstream(aiStack_190);
  return (bool)(local_1ba & 1);
}

Assistant:

static bool is_float(const std::string &aValue) {
    std::istringstream tStream(aValue);
    float tFloat;
    // noskipws considers leading whitespace invalid
    tStream >> std::noskipws >> tFloat;
    // Check the entire string was consumed
    // and if either failbit or badbit is set
    return tStream.eof() && !tStream.fail();
  }